

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O3

void __thiscall
QOpenGLShaderProgramPrivate::~QOpenGLShaderProgramPrivate(QOpenGLShaderProgramPrivate *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  *(undefined ***)this = &PTR__QOpenGLShaderProgramPrivate_001a1208;
  operator_delete(this->glfuncs,8);
  if (this->programGuard != (QOpenGLSharedResourceGuard *)0x0) {
    QOpenGLSharedResource::free();
  }
  QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::~QArrayDataPointer
            ((QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc> *)&this->binaryProgram);
  pDVar1 = (this->anonShaders).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->anonShaders).d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar1 = (this->shaders).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->shaders).d.d)->super_QArrayData,8,0x10);
    }
  }
  pDVar2 = (this->log).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->log).d.d)->super_QArrayData,2,0x10);
    }
  }
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QOpenGLShaderProgramPrivate::~QOpenGLShaderProgramPrivate()
{
    delete glfuncs;
    if (programGuard)
        programGuard->free();
}